

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_expression.hpp
# Opt level: O2

size_t jsoncons::jsonpath::
       remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
                 basic_string_view<char,_std::char_traits<char>_> *path_string)

{
  pointer pbVar1;
  size_t sVar2;
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_RCX;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  *__range2;
  size_t sVar3;
  basic_json_location<char,_std::allocator<char>_> *location;
  pointer location_00;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  locations;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  expr;
  
  locations.
  super__Vector_base<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  locations.
  super__Vector_base<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  locations.
  super__Vector_base<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  make_expression<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (&expr,(jsonpath *)path_string,(string_view_type *)&locations,in_RCX);
  std::
  vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~vector((vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             *)&locations);
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::select_paths(&locations,&expr,root,sort_descending|nodups);
  pbVar1 = locations.
           super__Vector_base<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = 0;
  for (location_00 = locations.
                     super__Vector_base<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; location_00 != pbVar1;
      location_00 = location_00 + 1) {
    sVar2 = remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      (root,location_00);
    sVar3 = sVar3 + sVar2;
  }
  std::
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  ::~vector(&locations);
  std::
  unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&expr.static_resources_);
  return sVar3;
}

Assistant:

std::size_t remove(Json& root, const jsoncons::basic_string_view<typename Json::char_type>& path_string)
    {
        std::size_t count = 0;

        auto expr = jsonpath::make_expression<Json>(path_string);
        std::vector<jsonpath::json_location> locations = expr.select_paths(root,
            jsonpath::result_options::nodups | jsonpath::result_options::sort_descending);

        for (const auto& location : locations)
        {
            std::size_t n = jsonpath::remove(root, location);
            count += n;
        }
        return count;
    }